

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingRush.cpp
# Opt level: O0

int shopping<std::multiset<std::pair<MarketProduct,int>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>>
              (timed_mutex *buy_mx,
              multiset<std::pair<MarketProduct,_int>,_std::less<std::pair<MarketProduct,_int>_>,_std::allocator<std::pair<MarketProduct,_int>_>_>
              *shop,string *shopname,int *budget,int threadid)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppVar5;
  type *ptVar6;
  ostream *poVar7;
  int local_6c;
  duration<long,_std::ratio<1L,_1000L>_> local_68 [2];
  undefined1 local_58 [8];
  unique_lock<std::timed_mutex> buy_lock;
  iterator elit;
  size_t size;
  bool checkout;
  int threadid_local;
  int *budget_local;
  string *shopname_local;
  multiset<std::pair<MarketProduct,_int>,_std::less<std::pair<MarketProduct,_int>_>,_std::allocator<std::pair<MarketProduct,_int>_>_>
  *shop_local;
  timed_mutex *buy_mx_local;
  
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        if (bVar1) {
          return 0;
        }
        sVar4 = std::
                multiset<std::pair<MarketProduct,_int>,_std::less<std::pair<MarketProduct,_int>_>,_std::allocator<std::pair<MarketProduct,_int>_>_>
                ::size(shop);
        if (sVar4 != 0) break;
        poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
        poVar7 = std::operator<<(poVar7,"] no more products in this shop");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        bVar1 = true;
      }
      buy_lock._8_8_ =
           std::
           multiset<std::pair<MarketProduct,_int>,_std::less<std::pair<MarketProduct,_int>_>,_std::allocator<std::pair<MarketProduct,_int>_>_>
           ::begin(shop);
      iVar3 = rand();
      std::advance<std::_Rb_tree_const_iterator<std::pair<MarketProduct,int>>,unsigned_long>
                ((_Rb_tree_const_iterator<std::pair<MarketProduct,_int>_> *)&buy_lock._M_owns,
                 (ulong)(long)iVar3 % sVar4);
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<MarketProduct,_int>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<MarketProduct,_int>_> *)
                          &buy_lock._M_owns);
      ptVar6 = std::get<1ul,MarketProduct,int>(ppVar5);
      if (*ptVar6 < *budget) break;
      poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
      poVar7 = std::operator<<(poVar7,"] budget exhausted");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      bVar1 = true;
    }
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<MarketProduct,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<MarketProduct,_int>_> *)&buy_lock._M_owns
                       );
    ptVar6 = std::get<1ul,MarketProduct,int>(ppVar5);
    *budget = *budget - *ptVar6;
    std::unique_lock<std::timed_mutex>::unique_lock
              ((unique_lock<std::timed_mutex> *)local_58,buy_mx);
    local_6c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)local_68,&local_6c);
    bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                      ((unique_lock<std::timed_mutex> *)local_58,local_68);
    bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = std::operator<<(poVar7,(string *)shopname);
      poVar7 = std::operator<<(poVar7,"] timeout");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      buy_mx_local._4_4_ = 1;
    }
    else {
      std::
      multiset<std::pair<MarketProduct,int>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>
      ::erase_abi_cxx11_((multiset<std::pair<MarketProduct,int>,std::less<std::pair<MarketProduct,int>>,std::allocator<std::pair<MarketProduct,int>>>
                          *)shop,(const_iterator)buy_lock._8_8_);
      poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = std::operator<<(poVar7,(string *)shopname);
      poVar7 = std::operator<<(poVar7,"] bought item, new budget ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*budget);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::unique_lock<std::timed_mutex>::~unique_lock((unique_lock<std::timed_mutex> *)local_58);
  } while (!bVar2);
  return buy_mx_local._4_4_;
}

Assistant:

int shopping(std::timed_mutex& buy_mx, shop_t& shop,
             const std::string& shopname, int& budget, const int threadid) {
  bool checkout = false;

  while (!checkout) {
    // try to buy things, but only if shop is not empty

    size_t size = shop.size();
    if (size != 0) {
      auto elit = shop.begin();
      // find random product in shop
      std::advance(elit, (std::rand() % size));
      if (std::get<1>(*elit) < budget) {
        budget -= std::get<1>(*elit);

        // be careful, erase modifies the shop, hence lock here
        std::unique_lock<std::timed_mutex> buy_lock(buy_mx, std::defer_lock);

        if (!buy_lock.try_lock_for(std::chrono::milliseconds(PATIENCE))) {
          std::cout << "[T " << threadid << ", " << shopname << "] timeout"
                    << std::endl;
          return TIMEOUT;
        }
        // remove item from shop
        shop.erase(elit);
        std::cout << "[T " << threadid << ", " << shopname
                  << "] bought item, new budget " << budget << std::endl;
      } else {
        std::cout << "[T " << threadid << "] budget exhausted" << std::endl;
        checkout = true;
      }
    } else {
      std::cout << "[T " << threadid << "] no more products in this shop"
                << std::endl;
      checkout = true;
    }
  }
  return CHECKOUT;
}